

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_637b3::GeneratedCode_DeepCloneMessageExtensions_Test::TestBody
          (GeneratedCode_DeepCloneMessageExtensions_Test *this)

{
  bool bVar1;
  upb_Arena *arena_00;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect *ppVar2;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 *msg_00;
  upb_Arena *arena_01;
  char *pcVar3;
  char *in_R9;
  upb_StringView uVar4;
  string local_108;
  AssertHelper local_e8;
  Message local_e0;
  upb_StringView local_d8;
  upb_StringView local_c8;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_98 [3];
  Message local_80;
  void *local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 *cloned_ext;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect *clone;
  upb_Arena *arena;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 *ext1;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect *msg;
  upb_Arena *source_arena;
  GeneratedCode_DeepCloneMessageExtensions_Test *this_local;
  
  arena_00 = upb_Arena_New();
  ppVar2 = protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect_new(arena_00);
  msg_00 = protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_new
                     (arena_00);
  uVar4 = upb_StringView_FromString("Hello1");
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_str(msg_00,uVar4)
  ;
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_message_set_extension
            (ppVar2,msg_00,arena_00);
  arena_01 = upb_Arena_New();
  ppVar2 = (protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect *)
           upb_Message_DeepClone
                     (&ppVar2->base_dont_copy_me__upb_internal_use_only,
                      &
                      protobuf_0test_0messages__proto2__TestAllTypesProto2__MessageSetCorrect_msg_init
                      ,arena_01);
  uVar4 = upb_StringView_FromString("HelloWorld2");
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_str(msg_00,uVar4)
  ;
  upb_Arena_Free(arena_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_message_set_extension
                   (ppVar2);
  local_78 = (void *)0x0;
  testing::internal::
  CmpHelperNE<protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_const*,decltype(nullptr)>
            ((internal *)local_70,"cloned_ext","nullptr",
             (protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 **)
             &gtest_ar.message_,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=(local_98,&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(&local_80);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_c8 = protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_str
                         ((protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1
                           *)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    local_d8 = upb_StringView_FromString("Hello1");
    local_b1 = ::upb_StringView_IsEqual(local_c8,local_d8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b0,&local_b1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_108,(internal *)local_b0,
                 (AssertionResult *)
                 "upb_StringView_IsEqual( protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_str( cloned_ext), upb_StringView_FromString(kTestStr1))"
                 ,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                 ,0x147,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    upb_Arena_Free(arena_01);
  }
  return;
}

Assistant:

TEST(GeneratedCode, DeepCloneMessageExtensions) {
  // Alloc and fill in test message with extension.
  upb_Arena* source_arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect_new(
          source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1*
      ext1 =
          protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_new(
              source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_str(
      ext1, upb_StringView_FromString(kTestStr1));
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_message_set_extension(
      msg, ext1, source_arena);
  // Create clone.
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect* clone =
      (protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrect*)
          upb_Message_DeepClone(
              UPB_UPCAST(msg),
              &protobuf_0test_0messages__proto2__TestAllTypesProto2__MessageSetCorrect_msg_init,
              arena);

  // Mutate original extension.
  protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_set_str(
      ext1, upb_StringView_FromString(kTestStr2));
  upb_Arena_Free(source_arena);

  const protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1*
      cloned_ext =
          protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_message_set_extension(
              clone);
  ASSERT_NE(cloned_ext, nullptr);
  EXPECT_TRUE(upb_StringView_IsEqual(
      protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_str(
          cloned_ext),
      upb_StringView_FromString(kTestStr1)));
  upb_Arena_Free(arena);
}